

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O1

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::Union
          (JoinRelationSetManager *this,JoinRelationSet *left,JoinRelationSet *right)

{
  ulong uVar1;
  ulong uVar2;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var3;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long *__s;
  JoinRelationSet *pJVar7;
  long lVar8;
  idx_t count;
  pointer *__ptr;
  ulong uVar9;
  ulong uVar10;
  _Head_base<0UL,_unsigned_long_*,_false> local_48;
  JoinRelationSet *local_40;
  JoinRelationSetManager *local_38;
  
  uVar1 = left->count;
  uVar2 = right->count;
  uVar9 = 0;
  uVar10 = -(ulong)(uVar1 + uVar2 >> 0x3d != 0) | (uVar1 + uVar2) * 8;
  local_40 = left;
  local_38 = this;
  __s = (unsigned_long *)operator_new__(uVar10);
  switchD_0105b559::default(__s,0,uVar10);
  count = 0;
  if (uVar1 != 0) {
    _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (local_40->relations).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    _Var4.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (right->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
         ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    count = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      if (uVar9 == uVar2) {
        if (uVar10 < uVar1) {
          _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (local_40->relations).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          do {
            __s[count] = *(unsigned_long *)
                          ((long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                          uVar10 * 8);
            count = count + 1;
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
        goto LAB_0176430a;
      }
      uVar5 = *(ulong *)((long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                        uVar10 * 8);
      uVar6 = *(ulong *)((long)_Var4.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                        uVar9 * 8);
      if (uVar5 < uVar6) {
        __s[count] = uVar5;
        uVar10 = uVar10 + 1;
      }
      else {
        if (uVar6 < uVar5) {
          __s[count] = uVar6;
        }
        else {
          __s[count] = uVar5;
          uVar10 = uVar10 + 1;
        }
        uVar9 = uVar9 + 1;
      }
      count = count + 1;
    } while (uVar10 != uVar1);
  }
  if (uVar9 < uVar2) {
    _Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (right->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
         ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
    lVar8 = 0;
    do {
      __s[count + lVar8] =
           *(unsigned_long *)
            (uVar9 * 8 + (long)_Var3.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
            lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (uVar2 - uVar9 != lVar8);
    count = count + lVar8;
  }
LAB_0176430a:
  local_48._M_head_impl = __s;
  pJVar7 = GetJoinRelation(local_38,(unsafe_unique_array<idx_t> *)&local_48,count);
  if (local_48._M_head_impl != (unsigned_long *)0x0) {
    operator_delete__(local_48._M_head_impl);
  }
  return pJVar7;
}

Assistant:

JoinRelationSet &JoinRelationSetManager::Union(JoinRelationSet &left, JoinRelationSet &right) {
	auto relations = make_unsafe_uniq_array<idx_t>(left.count + right.count);
	idx_t count = 0;
	// move through the left and right relations, eliminating duplicates
	idx_t i = 0, j = 0;
	while (true) {
		if (i == left.count) {
			// exhausted left relation, add remaining of right relation
			for (; j < right.count; j++) {
				relations[count++] = right.relations[j];
			}
			break;
		} else if (j == right.count) {
			// exhausted right relation, add remaining of left
			for (; i < left.count; i++) {
				relations[count++] = left.relations[i];
			}
			break;
		} else if (left.relations[i] < right.relations[j]) {
			// left is smaller, progress left and add it to the set
			relations[count++] = left.relations[i];
			i++;
		} else if (left.relations[i] > right.relations[j]) {
			// right is smaller, progress right and add it to the set
			relations[count++] = right.relations[j];
			j++;
		} else {
			D_ASSERT(left.relations[i] == right.relations[j]);
			relations[count++] = left.relations[i];
			i++;
			j++;
		}
	}
	return GetJoinRelation(std::move(relations), count);
}